

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

bool __thiscall
Clasp::DefaultUnfoundedCheck::isExternal(DefaultUnfoundedCheck *this,BodyPtr *n,weight_t *S)

{
  pointer pAVar1;
  Solver *pSVar2;
  GraphPtr pDVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  
  puVar4 = (n->node->super_Node).sep_;
  iVar5 = *S;
  uVar6 = *puVar4;
  if (((n->node->super_Node).field_0x7 & 0x20) == 0) {
    if (-1 < iVar5 && uVar6 != 0xffffffff) {
      pAVar1 = (this->atoms_).ebo_.buf;
      pSVar2 = this->solver_;
      pDVar3 = this->graph_;
      do {
        puVar4 = puVar4 + 1;
        if (((pAVar1[uVar6].field_0x3 & 0x40) != 0) &&
           (uVar6 = (pDVar3->atoms_).ebo_.buf[uVar6].super_Node.lit.rep_,
           (byte)(*(byte *)((long)(pSVar2->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc))
                 & 3) != (byte)(((uVar6 & 2) == 0) + 1U))) {
          iVar5 = iVar5 + -1;
          *S = iVar5;
        }
        uVar6 = *puVar4;
      } while ((uVar6 != 0xffffffff) && (-1 < iVar5));
    }
  }
  else if (-1 < iVar5 && uVar6 != 0xffffffff) {
    pAVar1 = (this->atoms_).ebo_.buf;
    pSVar2 = this->solver_;
    pDVar3 = this->graph_;
    do {
      if (((pAVar1[uVar6].field_0x3 & 0x40) != 0) &&
         (uVar6 = (pDVar3->atoms_).ebo_.buf[uVar6].super_Node.lit.rep_,
         (byte)(*(byte *)((long)(pSVar2->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc)) &
               3) != (byte)(((uVar6 & 2) == 0) + 1U))) {
        iVar5 = iVar5 - puVar4[1];
        *S = iVar5;
      }
      uVar6 = puVar4[2];
    } while ((uVar6 != 0xffffffff) && (puVar4 = puVar4 + 2, -1 < iVar5));
  }
  return -1 < *S;
}

Assistant:

bool DefaultUnfoundedCheck::isExternal(const BodyPtr& n, weight_t& S) const {
#define IN_UFS(id) ( (atoms_[(id)].ufs) && !solver_->isFalse(graph_->getAtom((id)).lit) )
	if (!n.node->sum()) {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; ++x) {
			if (IN_UFS(*x)) { S -= 1; }
		}
	}
	else {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; x+=2) {
			if (IN_UFS(*x)) { S -= static_cast<weight_t>(x[1]); }
		}
	}
	return S >= 0;
#undef IN_UFS
}